

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

void free_token(JSParseState *s,JSToken *token)

{
  int iVar1;
  JSContext *pJVar2;
  int64_t iVar3;
  JSValueUnion JVar4;
  JSValue v;
  JSValue v_00;
  
  iVar1 = token->val;
  if (iVar1 < -0x7c) {
    if (iVar1 + 0x7fU < 2) {
      iVar3 = (token->u).str.str.tag;
      if ((uint)iVar3 < 0xfffffff5) {
        return;
      }
      pJVar2 = s->ctx;
      JVar4 = (JSValueUnion)*(JSValueUnion *)&token->u;
LAB_0012c048:
      iVar1 = *JVar4.ptr;
      *(int *)JVar4.ptr = iVar1 + -1;
      if (1 < iVar1) {
        return;
      }
      v_00.tag = iVar3;
      v_00.u.ptr = JVar4.ptr;
      __JS_FreeValueRT(pJVar2->rt,v_00);
      return;
    }
    if (iVar1 == -0x7d) goto LAB_0012c001;
  }
  else {
    if (iVar1 == -0x7c) {
      pJVar2 = s->ctx;
      iVar3 = (token->u).str.str.tag;
      if (0xfffffff4 < (uint)iVar3) {
        JVar4 = (JSValueUnion)*(JSValueUnion *)&token->u;
        iVar1 = *JVar4.ptr;
        *(int *)JVar4.ptr = iVar1 + -1;
        if (iVar1 < 2) {
          v.tag = iVar3;
          v.u.ptr = JVar4.ptr;
          __JS_FreeValueRT(pJVar2->rt,v);
          pJVar2 = s->ctx;
        }
      }
      iVar3 = (token->u).regexp.flags.tag;
      if ((uint)iVar3 < 0xfffffff5) {
        return;
      }
      JVar4 = (JSValueUnion)((JSValueUnion *)((long)&token->u + 0x10))->ptr;
      goto LAB_0012c048;
    }
    if (iVar1 == -0x57) goto LAB_0012c001;
  }
  if (0x2d < iVar1 + 0x55U) {
    return;
  }
LAB_0012c001:
  JS_FreeAtom(s->ctx,(token->u).ident.atom);
  return;
}

Assistant:

static void free_token(JSParseState *s, JSToken *token)
{
    switch(token->val) {
#ifdef CONFIG_BIGNUM
    case TOK_NUMBER:
        JS_FreeValue(s->ctx, token->u.num.val);
        break;
#endif
    case TOK_STRING:
    case TOK_TEMPLATE:
        JS_FreeValue(s->ctx, token->u.str.str);
        break;
    case TOK_REGEXP:
        JS_FreeValue(s->ctx, token->u.regexp.body);
        JS_FreeValue(s->ctx, token->u.regexp.flags);
        break;
    case TOK_IDENT:
    case TOK_PRIVATE_NAME:
        JS_FreeAtom(s->ctx, token->u.ident.atom);
        break;
    default:
        if (token->val >= TOK_FIRST_KEYWORD &&
            token->val <= TOK_LAST_KEYWORD) {
            JS_FreeAtom(s->ctx, token->u.ident.atom);
        }
        break;
    }
}